

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O1

int cvHandleFailure(CVodeMem cv_mem,int flag)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  sunrealtype sVar4;
  sunrealtype sVar5;
  
  switch(flag) {
  case -0x1f:
    sVar4 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg the projection function had repeated recoverable errors.";
    iVar2 = -0x1f;
    iVar1 = 0xe9e;
    break;
  case -0x1e:
    sVar4 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg the projection function failed with an unrecoverable error.";
    iVar2 = -0x1e;
    iVar1 = 0xe9a;
    break;
  case -0x1d:
    pcVar3 = "proj_mem = NULL illegal.";
    iVar2 = -0x1d;
    iVar1 = 0xe96;
    goto LAB_0010e7ae;
  case -0x1c:
  case -0x1a:
  case -0x19:
  case -0x18:
  case -0x17:
  case -0x16:
  case -0x14:
  case -0x13:
  case -0x12:
  case -0x11:
  case -0xd:
  case -9:
  case -5:
    goto switchD_0010e5d6_caseD_ffffffe4;
  case -0x1b:
    pcVar3 = "tout too close to t0 to start integration.";
    iVar2 = -0x1b;
    iVar1 = 0xe7f;
    goto LAB_0010e7ae;
  case -0x15:
    pcVar3 = "cvode_mem = NULL illegal.";
    cv_mem = (CVodeMem)0x0;
    iVar2 = -0x15;
    iVar1 = 0xe83;
    goto LAB_0010e7ae;
  case -0x10:
    sVar4 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg, the nonlinear solver failed in an unrecoverable manner.";
    iVar2 = -0x10;
    iVar1 = 0xe92;
    break;
  case -0xf:
    sVar4 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg, unable to satisfy inequality constraints.";
    iVar2 = -0xf;
    iVar1 = 0xe8e;
    break;
  case -0xe:
    sVar4 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg, the nonlinear solver setup failed unrecoverably.";
    iVar2 = -0xe;
    iVar1 = 0xe8a;
    break;
  case -0xc:
    sVar4 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg, the rootfinding routine failed in an unrecoverable manner.";
    iVar2 = -0xc;
    iVar1 = 0xe7b;
    break;
  case -0xb:
    sVar4 = cv_mem->cv_tn;
    pcVar3 = 
    "At t = %lg, the right-hand side failed in a recoverable manner, but no recovery is possible.";
    iVar2 = -0xb;
    iVar1 = 0xe73;
    break;
  case -10:
    sVar4 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg repeated recoverable right-hand side function errors.";
    iVar2 = -10;
    iVar1 = 0xe77;
    break;
  case -8:
    sVar4 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg, the right-hand side routine failed in an unrecoverable manner.";
    iVar2 = -8;
    iVar1 = 0xe6f;
    break;
  case -7:
    sVar4 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg, the solve routine failed in an unrecoverable manner.";
    iVar2 = -7;
    iVar1 = 0xe6b;
    break;
  case -6:
    sVar4 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg, the setup routine failed in an unrecoverable manner.";
    iVar2 = -6;
    iVar1 = 0xe67;
    break;
  case -4:
    sVar4 = cv_mem->cv_h;
    sVar5 = cv_mem->cv_tn;
    pcVar3 = 
    "At t = %lg and h = %lg, the corrector convergence test failed repeatedly or with |h| = hmin.";
    iVar2 = -4;
    iVar1 = 0xe63;
    goto LAB_0010e8ee;
  case -3:
    sVar4 = cv_mem->cv_h;
    sVar5 = cv_mem->cv_tn;
    pcVar3 = "At t = %lg and h = %lg, the error test failed repeatedly or with |h| = hmin.";
    iVar2 = -3;
    iVar1 = 0xe5f;
LAB_0010e8ee:
    cvProcessError(cv_mem,iVar2,iVar1,"cvHandleFailure",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode.c"
                   ,pcVar3,sVar5,sVar4);
    return flag;
  default:
    if (flag == -9999) {
      sVar4 = cv_mem->cv_tn;
      pcVar3 = "At t = %lg, the nonlinear solver was passed a NULL input.";
      iVar2 = -0x15;
      iVar1 = 0xe86;
      break;
    }
    goto switchD_0010e5d6_caseD_ffffffe4;
  }
  cvProcessError(cv_mem,iVar2,iVar1,"cvHandleFailure",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode.c"
                 ,pcVar3,sVar4);
  return flag;
switchD_0010e5d6_caseD_ffffffe4:
  pcVar3 = 
  "CVODE encountered an unrecognized error. Please report this to the SUNDIALS developers at sundials-users@llnl.gov"
  ;
  flag = -99;
  iVar2 = -99;
  iVar1 = 0xea3;
LAB_0010e7ae:
  cvProcessError(cv_mem,iVar2,iVar1,"cvHandleFailure",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode.c"
                 ,pcVar3);
  return flag;
}

Assistant:

static int cvHandleFailure(CVodeMem cv_mem, int flag)
{
  /* Set vector of  absolute weighted local errors */
  /*
  N_VProd(acor, ewt, tempv);
  N_VAbs(tempv, tempv);
  */

  /* Depending on flag, print error message and return error flag */
  switch (flag)
  {
  case CV_ERR_FAILURE:
    cvProcessError(cv_mem, CV_ERR_FAILURE, __LINE__, __func__, __FILE__,
                   MSGCV_ERR_FAILS, cv_mem->cv_tn, cv_mem->cv_h);
    break;
  case CV_CONV_FAILURE:
    cvProcessError(cv_mem, CV_CONV_FAILURE, __LINE__, __func__, __FILE__,
                   MSGCV_CONV_FAILS, cv_mem->cv_tn, cv_mem->cv_h);
    break;
  case CV_LSETUP_FAIL:
    cvProcessError(cv_mem, CV_LSETUP_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_SETUP_FAILED, cv_mem->cv_tn);
    break;
  case CV_LSOLVE_FAIL:
    cvProcessError(cv_mem, CV_LSOLVE_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_SOLVE_FAILED, cv_mem->cv_tn);
    break;
  case CV_RHSFUNC_FAIL:
    cvProcessError(cv_mem, CV_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_RHSFUNC_FAILED, cv_mem->cv_tn);
    break;
  case CV_UNREC_RHSFUNC_ERR:
    cvProcessError(cv_mem, CV_UNREC_RHSFUNC_ERR, __LINE__, __func__, __FILE__,
                   MSGCV_RHSFUNC_UNREC, cv_mem->cv_tn);
    break;
  case CV_REPTD_RHSFUNC_ERR:
    cvProcessError(cv_mem, CV_REPTD_RHSFUNC_ERR, __LINE__, __func__, __FILE__,
                   MSGCV_RHSFUNC_REPTD, cv_mem->cv_tn);
    break;
  case CV_RTFUNC_FAIL:
    cvProcessError(cv_mem, CV_RTFUNC_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_RTFUNC_FAILED, cv_mem->cv_tn);
    break;
  case CV_TOO_CLOSE:
    cvProcessError(cv_mem, CV_TOO_CLOSE, __LINE__, __func__, __FILE__,
                   MSGCV_TOO_CLOSE);
    break;
  case CV_MEM_NULL:
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    break;
  case SUN_ERR_ARG_CORRUPT:
    cvProcessError(cv_mem, CV_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGCV_NLS_INPUT_NULL, cv_mem->cv_tn);
    break;
  case CV_NLS_SETUP_FAIL:
    cvProcessError(cv_mem, CV_NLS_SETUP_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_NLS_SETUP_FAILED, cv_mem->cv_tn);
    break;
  case CV_CONSTR_FAIL:
    cvProcessError(cv_mem, CV_CONSTR_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_FAILED_CONSTR, cv_mem->cv_tn);
    break;
  case CV_NLS_FAIL:
    cvProcessError(cv_mem, CV_NLS_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_NLS_FAIL, cv_mem->cv_tn);
    break;
  case CV_PROJ_MEM_NULL:
    cvProcessError(cv_mem, CV_PROJ_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSG_CV_PROJ_MEM_NULL);
    break;
  case CV_PROJFUNC_FAIL:
    cvProcessError(cv_mem, CV_PROJFUNC_FAIL, __LINE__, __func__, __FILE__,
                   MSG_CV_PROJFUNC_FAIL, cv_mem->cv_tn);
    break;
  case CV_REPTD_PROJFUNC_ERR:
    cvProcessError(cv_mem, CV_REPTD_PROJFUNC_ERR, __LINE__, __func__, __FILE__,
                   MSG_CV_REPTD_PROJFUNC_ERR, cv_mem->cv_tn);
    break;
  default:
    /* This return should never happen */
    cvProcessError(cv_mem, CV_UNRECOGNIZED_ERR, __LINE__, __func__,
                   __FILE__, "CVODE encountered an unrecognized error. Please report this to the SUNDIALS developers at sundials-users@llnl.gov");
    return (CV_UNRECOGNIZED_ERR);
  }

  return (flag);
}